

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

void __thiscall
glcts::BlendTestCaseGroup::BlendTest::getTestColors(BlendTest *this,int index,Vec4 *src,Vec4 *dst)

{
  GLfloat *pGVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vector<float,_4> res;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48 [6];
  float afStack_30 [4];
  long lVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  pGVar1 = this->m_colors;
  lVar4 = (long)(index << 3);
  fVar6 = 0.0;
  if (*(int *)(lVar3 + 8) < 1) {
    fVar8 = 0.0;
  }
  else {
    fVar8 = pGVar1[lVar4];
  }
  if (*(int *)(lVar3 + 0xc) < 1) {
    fVar9 = 0.0;
  }
  else {
    fVar9 = pGVar1[lVar4 + 1];
  }
  if (*(int *)(lVar3 + 0x10) < 1) {
    fVar10 = 0.0;
  }
  else {
    fVar10 = pGVar1[lVar4 + 2];
  }
  fVar7 = 1.0;
  if (*(int *)(lVar3 + 0x14) < 1) {
    fVar11 = 1.0;
  }
  else {
    fVar11 = pGVar1[lVar4 + 3];
  }
  src->m_data[0] = fVar8;
  src->m_data[1] = fVar9;
  src->m_data[2] = fVar10;
  src->m_data[3] = fVar11;
  if (*(int *)(lVar3 + 8) < 1) {
    fVar8 = 0.0;
  }
  else {
    fVar8 = pGVar1[lVar4 + 4];
  }
  if (*(int *)(lVar3 + 0xc) < 1) {
    fVar9 = 0.0;
  }
  else {
    fVar9 = pGVar1[lVar4 + 5];
  }
  if (0 < *(int *)(lVar3 + 0x10)) {
    fVar6 = pGVar1[lVar4 + 6];
  }
  if (0 < *(int *)(lVar3 + 0x14)) {
    fVar7 = pGVar1[lVar4 + 7];
  }
  dst->m_data[0] = fVar8;
  dst->m_data[1] = fVar9;
  dst->m_data[2] = fVar6;
  dst->m_data[3] = fVar7;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  lVar4 = 0;
  do {
    afStack_30[lVar4] = 1.0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_58 = 0;
  uStack_50 = 0;
  lVar4 = 0;
  do {
    fVar6 = src->m_data[lVar4];
    fVar8 = afStack_30[lVar4];
    if (fVar6 <= afStack_30[lVar4]) {
      fVar8 = fVar6;
    }
    uVar5 = -(uint)(fVar6 < local_48[lVar4]);
    *(uint *)((long)&local_58 + lVar4 * 4) = uVar5 & (uint)local_48[lVar4] | ~uVar5 & (uint)fVar8;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  *(undefined8 *)src->m_data = local_58;
  *(undefined8 *)(src->m_data + 2) = uStack_50;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  lVar4 = 0;
  do {
    afStack_30[lVar4] = 1.0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_58 = 0;
  uStack_50 = 0;
  lVar4 = 0;
  do {
    fVar6 = dst->m_data[lVar4];
    fVar8 = afStack_30[lVar4];
    if (fVar6 <= afStack_30[lVar4]) {
      fVar8 = fVar6;
    }
    uVar5 = -(uint)(fVar6 < local_48[lVar4]);
    *(uint *)((long)&local_58 + lVar4 * 4) = uVar5 & (uint)local_48[lVar4] | ~uVar5 & (uint)fVar8;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  *(undefined8 *)dst->m_data = local_58;
  *(undefined8 *)(dst->m_data + 2) = uStack_50;
  fVar6 = dst->m_data[1];
  fVar8 = dst->m_data[2];
  if (*(int *)(lVar3 + 0x14) == 0) {
    fVar9 = 1.0;
  }
  else {
    fVar9 = (float)(1 << ((byte)*(int *)(lVar3 + 0x14) & 0x1f)) + -1.0;
    fVar9 = (float)((long)(dst->m_data[3] * fVar9) & 0xffffffff) / fVar9;
  }
  fVar10 = (float)(1 << ((byte)*(undefined4 *)(lVar3 + 0x10) & 0x1f)) + -1.0;
  fVar7 = (float)(1 << ((byte)*(undefined4 *)(lVar3 + 0xc) & 0x1f)) + -1.0;
  fVar11 = (float)(1 << ((byte)*(undefined4 *)(lVar3 + 8) & 0x1f)) + -1.0;
  dst->m_data[0] = (float)((long)(dst->m_data[0] * fVar11) & 0xffffffff) / fVar11;
  dst->m_data[1] = (float)((long)(fVar6 * fVar7) & 0xffffffff) / fVar7;
  dst->m_data[2] = (float)((long)(fVar8 * fVar10) & 0xffffffff) / fVar10;
  dst->m_data[3] = fVar9;
  return;
}

Assistant:

void BlendTestCaseGroup::BlendTest::getTestColors(int index, tcu::Vec4& src, tcu::Vec4& dst) const
{
	DE_ASSERT(0 <= index && index < m_numColors);

	const tcu::RenderTarget& rt = m_context.getRenderContext().getRenderTarget();
	const tcu::PixelFormat&  pf = rt.getPixelFormat();
	const glw::GLfloat*		 s  = m_colors + 8 * index;

	src = MaskChannels(pf, tcu::Vec4(s[0], s[1], s[2], s[3]));
	dst = MaskChannels(pf, tcu::Vec4(s[4], s[5], s[6], s[7]));
	src = tcu::clamp(src, tcu::Vec4(0.f), tcu::Vec4(1.f));
	dst = tcu::clamp(dst, tcu::Vec4(0.f), tcu::Vec4(1.f));

	// Quantize the destination channels
	// this matches what implementation does on render target write
	dst = QuantizeChannels(pf, dst);
}